

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

void inblock(char *s)

{
  int iVar1;
  char *pcVar2;
  Item *q;
  int l;
  char *cp;
  char *in_stack_00000088;
  char *in_stack_00000090;
  char *in_stack_ffffffffffffffd8;
  Item *in_stack_ffffffffffffffe0;
  short type;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  iVar3 = linenum;
  while( true ) {
    pcVar2 = Gets((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe8));
    if (pcVar2 == (char *)0x0) {
      linenum = iVar3;
      diag((char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    }
    type = (short)((ulong)in_stack_ffffffffffffffe0 >> 0x30);
    iVar1 = isend(in_stack_00000090,in_stack_00000088);
    if (iVar1 != 0) break;
    in_stack_ffffffffffffffe0 = putintoken((char *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),type);
    in_stack_ffffffffffffffe0->itemtype = 0x102;
  }
  return;
}

Assistant:

void inblock(s)
	char           *s;
{				/* copy input verbatim to intoken up to END*s
				 * error if we get the whole input */
	char            *cp;
	int             l;
	Item		*q;

	l = linenum;
	for (;;) {
		cp = Gets(buf);
		if (cp == (char *) 0) {
			linenum = l;
			diag(s, " block goes to end of file");
		}
		if (isend(s, buf)) {
			break;
		}
		q = putintoken(buf, STRING);
		q->itemtype = VERBATIM;
	}
}